

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_float_test.cpp
# Opt level: O1

void __thiscall
reflect_value_cast_float_test_float_to_short_cast_Test::TestBody
          (reflect_value_cast_float_test_float_to_short_cast_Test *this)

{
  undefined8 uVar1;
  char *message;
  AssertionResult gtest_ar;
  Message local_40;
  AssertHelper local_38;
  float local_2c;
  internal local_28 [8];
  undefined8 *local_20;
  
  uVar1 = value_create_float(0x42c8a5e3);
  local_2c = (float)value_to_float(uVar1);
  uVar1 = value_type_cast(uVar1,2);
  local_40.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_2_ = (undefined2)(int)local_2c;
  local_38.data_._0_2_ = value_to_short(uVar1);
  testing::internal::CmpHelperEQ<short,short>
            (local_28,"(short)f","(short)value_to_short(v)",(short *)&local_40,(short *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_float_test.cpp"
               ,0x41,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT62(local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._2_6_,
                         local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_2_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT62(local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._2_6_,
                                     local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_2_) + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  value_destroy(uVar1);
  return;
}

Assistant:

TEST_F(reflect_value_cast_float_test, float_to_short_cast)
{
	value v = value_create_float(100.324f);

	float f = value_to_float(v);

	v = value_type_cast(v, TYPE_SHORT);

	EXPECT_EQ((short)f, (short)value_to_short(v));

	value_destroy(v);
}